

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

JDIMENSION jpeg_read_raw_data(j_decompress_ptr cinfo,JSAMPIMAGE data,JDIMENSION max_lines)

{
  int iVar1;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  JDIMENSION lines_per_iMCU_row;
  uint local_4;
  
  if (*(int *)((long)in_RDI + 0x24) != 0xce) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(uint *)(in_RDI + 0x15) < *(uint *)((long)in_RDI + 0x8c)) {
    if (in_RDI[2] != 0) {
      *(ulong *)(in_RDI[2] + 8) = (ulong)*(uint *)(in_RDI + 0x15);
      *(ulong *)(in_RDI[2] + 0x10) = (ulong)*(uint *)((long)in_RDI + 0x8c);
      (**(code **)in_RDI[2])(in_RDI);
    }
    local_4 = *(int *)((long)in_RDI + 0x19c) * (int)in_RDI[0x34];
    if (in_EDX < local_4) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x17;
      (**(code **)*in_RDI)(in_RDI);
    }
    iVar1 = (**(code **)(in_RDI[0x46] + 0x18))(in_RDI,in_RSI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      *(uint *)(in_RDI + 0x15) = local_4 + (int)in_RDI[0x15];
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x7b;
    (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_raw_data(j_decompress_ptr cinfo, JSAMPIMAGE data,
                   JDIMENSION max_lines)
{
  JDIMENSION lines_per_iMCU_row;

  if (cinfo->global_state != DSTATE_RAW_OK)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long)cinfo->output_scanline;
    cinfo->progress->pass_limit = (long)cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
  }

  /* Verify that at least one iMCU row can be returned. */
  lines_per_iMCU_row = cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size;
  if (max_lines < lines_per_iMCU_row)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* Decompress directly into user's buffer. */
  if (!(*cinfo->coef->decompress_data) (cinfo, data))
    return 0;                   /* suspension forced, can do nothing more */

  /* OK, we processed one iMCU row. */
  cinfo->output_scanline += lines_per_iMCU_row;
  return lines_per_iMCU_row;
}